

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_DropInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  AInventory *val;
  bool bVar1;
  bool local_61;
  AInventory *local_60;
  bool local_53;
  AInventory *state;
  AInventory *item;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x417,
                  "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x417,
                  "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_53 = true;
  if (this != (AActor *)0x0) {
    local_53 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_53 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x417,
                  "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x418,
                  "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar1 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
    bVar1 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar1) {
    if (param[1].field_0.field_1.a == (void *)0x0) {
      NullParam("\"item\"");
      local_60 = (AInventory *)param[1].field_0.field_1.a;
    }
    else {
      local_60 = (AInventory *)param[1].field_0.field_1.a;
    }
    local_61 = true;
    if (local_60 != (AInventory *)0x0) {
      local_61 = DObject::IsKindOf((DObject *)local_60,AInventory::RegistrationInfo.MyClass);
    }
    if (local_61 != false) {
      val = AActor::DropInventory(this,local_60);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x419,
                        "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,val,1);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x418,
                  "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x418,
                "int AF_AActor_DropInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DropInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	ACTION_RETURN_OBJECT(self->DropInventory(item));
}